

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PrecisionRecallCurve::~PrecisionRecallCurve(PrecisionRecallCurve *this)

{
  PrecisionRecallCurve *this_local;
  
  ~PrecisionRecallCurve(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

PrecisionRecallCurve::~PrecisionRecallCurve() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.PrecisionRecallCurve)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}